

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

size_t Catch::listTags(Config *config)

{
  size_t sVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestSpecParser *this;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases;
  iterator iVar3;
  _Rb_tree_node_base *p_Var4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_bool>
  pVar7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  tagCounts;
  string lcaseTagName;
  string tagName;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  TestSpec testSpec;
  Text wrapper;
  ostringstream oss;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  local_330;
  undefined1 local_300 [32];
  pointer local_2e0;
  pointer local_2d8;
  _Rb_tree_node_base *local_2d0;
  string local_2c8;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> local_2a8;
  TestSpec local_290;
  Text local_278;
  TagInfo local_220;
  size_type local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  _Base_ptr local_170;
  _Base_ptr p_Stack_168;
  pointer local_160;
  pointer pFStack_158;
  pointer local_150;
  pointer pFStack_148;
  TagAliasRegistry *local_140;
  
  iVar2 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])();
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
            (&local_290.m_filters,
             (vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
             CONCAT44(extraout_var,iVar2));
  iVar2 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])(config);
  if (*(long *)CONCAT44(extraout_var_00,iVar2) == ((long *)CONCAT44(extraout_var_00,iVar2))[1]) {
    std::operator<<((ostream *)&std::cout,"All available tags:\n");
    TagAliasRegistry::get();
    local_190._M_allocated_capacity = (size_type)&local_180;
    local_190._8_8_ = 0;
    local_180._M_local_buf[0] = '\0';
    local_170 = (_Base_ptr)0x0;
    p_Stack_168 = (_Base_ptr)0x0;
    local_160 = (pointer)0x0;
    pFStack_158 = (pointer)0x0;
    local_150 = (pointer)0x0;
    pFStack_148 = (pointer)0x0;
    local_140 = &TagAliasRegistry::get::instance;
    std::__cxx11::string::string((string *)&local_278,"*",(allocator *)&local_2c8);
    this = TestSpecParser::parse((TestSpecParser *)local_1a8,&local_278.str);
    TestSpecParser::testSpec((TestSpec *)&local_330,this);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::operator=
              (&local_290.m_filters,
               (vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               &local_330);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               &local_330);
    std::__cxx11::string::_M_dispose();
    TestSpecParser::~TestSpecParser((TestSpecParser *)local_1a8);
  }
  else {
    std::operator<<((ostream *)&std::cout,"Tags for matching test cases:\n");
  }
  local_330._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_330._M_impl.super__Rb_tree_header._M_header;
  local_330._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_330._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_330._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_330._M_impl.super__Rb_tree_header._M_header._M_right =
       local_330._M_impl.super__Rb_tree_header._M_header._M_left;
  testCases = getAllTestCasesSorted((IConfig *)config);
  filterTests(&local_2a8,testCases,&local_290,(IConfig *)config);
  local_2e0 = local_2a8.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  while (local_2a8.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
         super__Vector_impl_data._M_start != local_2e0) {
    local_2d0 = &((local_2a8.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
                   _M_impl.super__Vector_impl_data._M_start)->super_TestCaseInfo).tags._M_t._M_impl.
                 super__Rb_tree_header._M_header;
    local_2d8 = local_2a8.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
                _M_impl.super__Vector_impl_data._M_start;
    for (p_Var4 = ((local_2a8.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
                    _M_impl.super__Vector_impl_data._M_start)->super_TestCaseInfo).tags._M_t._M_impl
                  .super__Rb_tree_header._M_header._M_left; p_Var4 != local_2d0;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      std::__cxx11::string::string((string *)&local_2c8,(string *)(p_Var4 + 1));
      toLower((string *)local_300,&local_2c8);
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
              ::find(&local_330,(string *)local_300);
      if ((_Rb_tree_header *)iVar3._M_node == &local_330._M_impl.super__Rb_tree_header) {
        std::__cxx11::string::string((string *)&local_1c8,(string *)local_300);
        local_220.spellings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_220.spellings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_220.spellings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_220.spellings._M_t._M_impl.super__Rb_tree_header._M_header;
        local_220.spellings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_220.count = 0;
        local_220.spellings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_220.spellings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
        ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
                *)&local_278,&local_1c8,&local_220);
        std::pair<std::__cxx11::string_const,Catch::TagInfo>::
        pair<std::__cxx11::string,Catch::TagInfo>
                  ((pair<std::__cxx11::string_const,Catch::TagInfo> *)local_1a8,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
                    *)&local_278);
        pVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                ::_M_insert_unique(&local_330,
                                   (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
                                    *)local_1a8);
        iVar3._M_node = (_Base_ptr)pVar7.first._M_node;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
                 *)local_1a8);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
                 *)&local_278);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_220);
        std::__cxx11::string::_M_dispose();
      }
      TagInfo::add((TagInfo *)(iVar3._M_node + 2),&local_2c8);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    local_2a8.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
    super__Vector_impl_data._M_start = local_2d8 + 1;
  }
  for (p_Var6 = local_330._M_impl.super__Rb_tree_header._M_header._M_left;
      sVar1 = local_330._M_impl.super__Rb_tree_header._M_node_count,
      (_Rb_tree_header *)p_Var6 != &local_330._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar5 = std::operator<<((ostream *)local_1a8,"  ");
    *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 2;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::operator<<(poVar5,"  ");
    TagInfo::all_abi_cxx11_(&local_2c8,(TagInfo *)(p_Var6 + 2));
    local_300._16_8_ = 0x4f;
    local_300[0x18] = '\t';
    local_300._0_8_ = (pointer)0x0;
    local_300._8_8_ = 0;
    std::__cxx11::stringbuf::str();
    local_300._8_8_ = local_1e0;
    local_300._16_8_ = 0x46;
    Tbc::Text::Text(&local_278,&local_2c8,(TextAttributes *)local_300);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::stringbuf::str();
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)&local_2c8);
    poVar5 = Tbc::operator<<(poVar5,&local_278);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::_M_dispose();
    Tbc::Text::~Text(&local_278);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  }
  std::__cxx11::string::string((string *)&local_278,"tag",(allocator *)&local_2c8);
  local_1a8._0_8_ = sVar1;
  std::__cxx11::string::string((string *)(local_1a8 + 8),(string *)&local_278);
  operator<<((ostream *)&std::cout,(pluralise *)local_1a8);
  poVar5 = std::operator<<((ostream *)&std::cout,"\n");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  sVar1 = local_330._M_impl.super__Rb_tree_header._M_node_count;
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector(&local_2a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  ::~_Rb_tree(&local_330);
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            (&local_290.m_filters);
  return (size_t)(pointer)sVar1;
}

Assistant:

inline std::size_t listTags( Config const& config ) {
        TestSpec testSpec = config.testSpec();
        if( config.testSpec().hasFilters() )
            Catch::cout() << "Tags for matching test cases:\n";
        else {
            Catch::cout() << "All available tags:\n";
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "*" ).testSpec();
        }

        std::map<std::string, TagInfo> tagCounts;

        std::vector<TestCase> matchedTestCases = filterTests( getAllTestCasesSorted( config ), testSpec, config );
        for( std::vector<TestCase>::const_iterator it = matchedTestCases.begin(), itEnd = matchedTestCases.end();
                it != itEnd;
                ++it ) {
            for( std::set<std::string>::const_iterator  tagIt = it->getTestCaseInfo().tags.begin(),
                                                        tagItEnd = it->getTestCaseInfo().tags.end();
                    tagIt != tagItEnd;
                    ++tagIt ) {
                std::string tagName = *tagIt;
                std::string lcaseTagName = toLower( tagName );
                std::map<std::string, TagInfo>::iterator countIt = tagCounts.find( lcaseTagName );
                if( countIt == tagCounts.end() )
                    countIt = tagCounts.insert( std::make_pair( lcaseTagName, TagInfo() ) ).first;
                countIt->second.add( tagName );
            }
        }

        for( std::map<std::string, TagInfo>::const_iterator countIt = tagCounts.begin(),
                                                            countItEnd = tagCounts.end();
                countIt != countItEnd;
                ++countIt ) {
            std::ostringstream oss;
            oss << "  " << std::setw(2) << countIt->second.count << "  ";
            Text wrapper( countIt->second.all(), TextAttributes()
                                                    .setInitialIndent( 0 )
                                                    .setIndent( oss.str().size() )
                                                    .setWidth( CATCH_CONFIG_CONSOLE_WIDTH-10 ) );
            Catch::cout() << oss.str() << wrapper << "\n";
        }
        Catch::cout() << pluralise( tagCounts.size(), "tag" ) << "\n" << std::endl;
        return tagCounts.size();
    }